

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_That_Test::Body(iu_SyntaxTest_x_iutest_x_That_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  detail *pdVar3;
  AssertionResult *in_R8;
  string local_920;
  string local_900;
  AssertionHelper local_8e0;
  Fixed local_8b0;
  int local_724;
  NeMatcher<int> local_720;
  undefined1 local_710 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_6e0 [4];
  int x_3;
  string local_6c0;
  AssertionHelper local_6a0;
  Fixed local_670;
  int local_4e4;
  GeMatcher<int> local_4e0;
  undefined1 local_4d0 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_4a0 [4];
  int x_2;
  string local_480;
  AssertionHelper local_460;
  Fixed local_430;
  int local_2a4;
  LeMatcher<int> local_2a0;
  undefined1 local_290 [8];
  AssertionResult iutest_ar_1;
  int x_1;
  string local_240;
  AssertionHelper local_220;
  Fixed local_1f0;
  int local_54;
  EqMatcher<int> local_50;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  int x;
  iu_SyntaxTest_x_iutest_x_That_Test *this_local;
  
  iutest_ar._36_4_ = 1;
  iutest::detail::AlwaysZero();
  local_54 = 1;
  iutest::matchers::Eq<int>((matchers *)&local_50,&local_54);
  iutest::detail::EqMatcher<int>::operator()
            ((AssertionResult *)local_40,&local_50,(int *)&iutest_ar.field_0x24);
  iutest::detail::EqMatcher<int>::~EqMatcher(&local_50);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1f0,iutest_ar._36_4_);
    iutest::PrintToString<int>((string *)&x_1,(int *)&iutest_ar.field_0x24);
    pdVar3 = (detail *)std::__cxx11::string::c_str();
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_240,pdVar3,"::iutest::Eq(1)",local_40,in_R8);
    in_R8 = (AssertionResult *)0x2;
    iutest::AssertionHelper::AssertionHelper
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x273,&local_240,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_220,pFVar2);
    iutest::AssertionHelper::~AssertionHelper(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&x_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = true;
    iutest_ar_1._33_3_ = 0;
    iutest::detail::AlwaysZero();
    local_2a4 = 1;
    iutest::matchers::Le<int>((matchers *)&local_2a0,&local_2a4);
    iutest::detail::LeMatcher<int>::operator()
              ((AssertionResult *)local_290,&local_2a0,(int *)&iutest_ar_1.m_result);
    iutest::detail::LeMatcher<int>::~LeMatcher(&local_2a0);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
    if (!bVar1) {
      memset(&local_430,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_430);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_430,iutest_ar_1._32_4_);
      iutest::PrintToString<int>((string *)local_4a0,(int *)&iutest_ar_1.m_result);
      pdVar3 = (detail *)std::__cxx11::string::c_str();
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_480,pdVar3,"::iutest::Le(1)",local_290,in_R8);
      in_R8 = (AssertionResult *)0x1;
      iutest::AssertionHelper::AssertionHelper
                (&local_460,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x275,&local_480,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_460,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_460);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)local_4a0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_430);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_290);
    iutest_ar_2._36_4_ = 1;
    iutest::detail::AlwaysZero();
    local_4e4 = 1;
    iutest::matchers::Ge<int>((matchers *)&local_4e0,&local_4e4);
    iutest::detail::GeMatcher<int>::operator()
              ((AssertionResult *)local_4d0,&local_4e0,(int *)&iutest_ar_2.field_0x24);
    iutest::detail::GeMatcher<int>::~GeMatcher(&local_4e0);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
    if (!bVar1) {
      memset(&local_670,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_670);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_670,iutest_ar_2._36_4_);
      iutest::PrintToString<int>((string *)local_6e0,(int *)&iutest_ar_2.field_0x24);
      pdVar3 = (detail *)std::__cxx11::string::c_str();
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_6c0,pdVar3,"::iutest::Ge(1)",local_4d0,in_R8);
      in_R8 = (AssertionResult *)0xffffffff;
      iutest::AssertionHelper::AssertionHelper
                (&local_6a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x277,&local_6c0,kWarning);
      iutest::AssertionHelper::operator=(&local_6a0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_6a0);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)local_6e0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_670);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
    iutest_ar_3._36_4_ = 1;
    iutest::detail::AlwaysZero();
    local_724 = 0;
    iutest::matchers::Ne<int>((matchers *)&local_720,&local_724);
    iutest::detail::NeMatcher<int>::operator()
              ((AssertionResult *)local_710,&local_720,(int *)&iutest_ar_3.field_0x24);
    iutest::detail::NeMatcher<int>::~NeMatcher(&local_720);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
    if (!bVar1) {
      memset(&local_8b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_8b0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_8b0,iutest_ar_3._36_4_);
      iutest::PrintToString<int>(&local_920,(int *)&iutest_ar_3.field_0x24);
      pdVar3 = (detail *)std::__cxx11::string::c_str();
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_900,pdVar3,"::iutest::Ne(0)",local_710,in_R8);
      iutest::AssertionHelper::AssertionHelper
                (&local_8e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x279,&local_900,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_8e0,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_920);
      iutest::AssertionHelper::Fixed::~Fixed(&local_8b0);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, That)
{
    if( int x=1 )
        IUTEST_ASSERT_THAT(x, ::iutest::Eq(1)) << x;
    if( int x=1 )
        IUTEST_EXPECT_THAT(x, ::iutest::Le(1)) << x;
    if( int x=1 )
        IUTEST_INFORM_THAT(x, ::iutest::Ge(1)) << x;
    if( int x=1 )
        IUTEST_ASSUME_THAT(x, ::iutest::Ne(0)) << x;
}